

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

bool __thiscall
cppnet::BufferBlock::GetUseMemoryBlock
          (BufferBlock *this,void **res1,uint32_t *len1,void **res2,uint32_t *len2)

{
  uint32_t *len2_local;
  void **res2_local;
  uint32_t *len1_local;
  void **res1_local;
  BufferBlock *this_local;
  
  *res2 = (void *)0x0;
  *res1 = (void *)0x0;
  *len2 = 0;
  *len1 = 0;
  if (this->_read < this->_write) {
    *res1 = this->_read;
    *len1 = (int)this->_write - (int)this->_read;
    this_local._7_1_ = true;
  }
  else if (((this->_can_read & 1U) == 0) && (this->_write == this->_read)) {
    this_local._7_1_ = false;
  }
  else {
    *res1 = this->_read;
    *len1 = (int)this->_buffer_end - (int)this->_read;
    *len2 = (int)this->_write - (int)this->_buffer_start;
    if (*len2 != 0) {
      *res2 = this->_buffer_start;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BufferBlock::GetUseMemoryBlock(void*& res1, uint32_t& len1, void*& res2, uint32_t& len2) {
    res1 = res2 = nullptr;
    len1 = len2 = 0;

    if (_read >= _write) {
        if (!_can_read && _write == _read) {
            return false;
        }
        res1 = _read;
        len1 = (uint32_t)(_buffer_end - _read);

        len2 = (uint32_t)(_write - _buffer_start);
        if(len2 > 0) {
            res2 = _buffer_start;
        }
        return true;

    } else {
        res1 = _read;
        len1 = (uint32_t)(_write - _read);
        return true;
    }
}